

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive_impl.h
# Opt level: O0

void test_exhaustive_extrakeys(secp256k1_context *ctx,secp256k1_ge *group)

{
  int iVar1;
  long in_RSI;
  int parity;
  uchar buf [33];
  secp256k1_scalar scalar_i;
  secp256k1_fe fe;
  int i;
  uchar xonly_pubkey_bytes [12] [32];
  int parities [12];
  secp256k1_xonly_pubkey xonly_pubkey [12];
  secp256k1_pubkey pubkey [12];
  secp256k1_keypair keypair [12];
  secp256k1_scalar *in_stack_fffffffffffff348;
  undefined4 in_stack_fffffffffffff350;
  int in_stack_fffffffffffff354;
  undefined1 local_ca8 [32];
  secp256k1_fe *in_stack_fffffffffffff378;
  secp256k1_fe *in_stack_fffffffffffff380;
  secp256k1_xonly_pubkey *in_stack_fffffffffffff3a8;
  undefined4 in_stack_fffffffffffff3b0;
  uint v;
  secp256k1_context *in_stack_fffffffffffff3b8;
  secp256k1_keypair *in_stack_fffffffffffff3c0;
  secp256k1_context *in_stack_fffffffffffff3c8;
  uchar *in_stack_fffffffffffff3d8;
  secp256k1_xonly_pubkey *in_stack_fffffffffffff3e0;
  secp256k1_context *in_stack_fffffffffffff3e8;
  int local_ac8 [686];
  long local_10;
  
  v = 1;
  local_10 = in_RSI;
  while( true ) {
    if (0xc < (int)v) {
      return;
    }
    secp256k1_scalar_set_int((secp256k1_scalar *)&stack0xfffffffffffff37c,v);
    secp256k1_scalar_get_b32
              ((uchar *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
               in_stack_fffffffffffff348);
    iVar1 = secp256k1_keypair_create
                      (in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,
                       (uchar *)in_stack_fffffffffffff3b8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
              ,0x1f,"test condition failed: secp256k1_keypair_create(ctx, &keypair[i - 1], buf)");
      abort();
    }
    iVar1 = secp256k1_ec_pubkey_create
                      (in_stack_fffffffffffff3c8,(secp256k1_pubkey *)in_stack_fffffffffffff3c0,
                       (uchar *)in_stack_fffffffffffff3b8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
              ,0x20,"test condition failed: secp256k1_ec_pubkey_create(ctx, &pubkey[i - 1], buf)");
      abort();
    }
    iVar1 = secp256k1_keypair_xonly_pub
                      (in_stack_fffffffffffff3c8,(secp256k1_xonly_pubkey *)in_stack_fffffffffffff3c0
                       ,(int *)in_stack_fffffffffffff3b8,
                       (secp256k1_keypair *)CONCAT44(v,in_stack_fffffffffffff3b0));
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
              ,0x23,
              "test condition failed: secp256k1_keypair_xonly_pub(ctx, &xonly_pubkey[i - 1], &parities[i - 1], &keypair[i - 1])"
             );
      abort();
    }
    iVar1 = secp256k1_xonly_pubkey_serialize
                      (in_stack_fffffffffffff3b8,(uchar *)CONCAT44(v,in_stack_fffffffffffff3b0),
                       in_stack_fffffffffffff3a8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
              ,0x24,
              "test condition failed: secp256k1_xonly_pubkey_serialize(ctx, xonly_pubkey_bytes[i - 1], &xonly_pubkey[i - 1])"
             );
      abort();
    }
    iVar1 = secp256k1_xonly_pubkey_parse
                      (in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8
                      );
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
              ,0x27,
              "test condition failed: secp256k1_xonly_pubkey_parse(ctx, &xonly_pubkey[i - 1], xonly_pubkey_bytes[i - 1])"
             );
      abort();
    }
    iVar1 = secp256k1_xonly_pubkey_serialize
                      (in_stack_fffffffffffff3b8,(uchar *)CONCAT44(v,in_stack_fffffffffffff3b0),
                       in_stack_fffffffffffff3a8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
              ,0x28,
              "test condition failed: secp256k1_xonly_pubkey_serialize(ctx, buf, &xonly_pubkey[i - 1])"
             );
      abort();
    }
    iVar1 = secp256k1_memcmp_var
                      (&stack0xfffffffffffff3b8 + (long)(int)(v - 1) * 0x20,local_ca8,0x20);
    if (iVar1 != 0) break;
    iVar1 = secp256k1_xonly_pubkey_from_pubkey
                      (in_stack_fffffffffffff3c8,(secp256k1_xonly_pubkey *)in_stack_fffffffffffff3c0
                       ,(int *)in_stack_fffffffffffff3b8,
                       (secp256k1_pubkey *)CONCAT44(v,in_stack_fffffffffffff3b0));
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
              ,0x2c,
              "test condition failed: secp256k1_xonly_pubkey_from_pubkey(ctx, &xonly_pubkey[i - 1], &parity, &pubkey[i - 1])"
             );
      abort();
    }
    if (in_stack_fffffffffffff354 != local_ac8[(int)(v - 1)]) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
              ,0x2d,"test condition failed: parity == parities[i - 1]");
      abort();
    }
    iVar1 = secp256k1_xonly_pubkey_serialize
                      (in_stack_fffffffffffff3b8,(uchar *)CONCAT44(v,in_stack_fffffffffffff3b0),
                       in_stack_fffffffffffff3a8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
              ,0x2e,
              "test condition failed: secp256k1_xonly_pubkey_serialize(ctx, buf, &xonly_pubkey[i - 1])"
             );
      abort();
    }
    iVar1 = secp256k1_memcmp_var
                      (&stack0xfffffffffffff3b8 + (long)(int)(v - 1) * 0x20,local_ca8,0x20);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
              ,0x2f,
              "test condition failed: secp256k1_memcmp_var(xonly_pubkey_bytes[i - 1], buf, 32) == 0"
             );
      abort();
    }
    secp256k1_fe_set_b32_mod
              ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
               (uchar *)in_stack_fffffffffffff348);
    iVar1 = secp256k1_fe_equal_var(in_stack_fffffffffffff380,in_stack_fffffffffffff378);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
              ,0x33,"test condition failed: secp256k1_fe_equal_var(&fe, &group[i].x)");
      abort();
    }
    memcpy(&stack0xfffffffffffff380,(void *)(local_10 + (long)(int)v * 0x68 + 0x30),0x30);
    secp256k1_fe_normalize_var((secp256k1_fe *)0x10e032);
    iVar1 = secp256k1_fe_is_odd((secp256k1_fe *)0x10e03c);
    if (iVar1 != local_ac8[(int)(v - 1)]) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
              ,0x38,"test condition failed: secp256k1_fe_is_odd(&fe) == parities[i - 1]");
      abort();
    }
    if (6 < (int)v) {
      iVar1 = secp256k1_memcmp_var
                        (&stack0xfffffffffffff3b8 + (long)(int)(v - 1) * 0x20,
                         &stack0xfffffffffffff3b8 + (long)(int)(0xc - v) * 0x20,0x20);
      if (iVar1 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
                ,0x3c,
                "test condition failed: secp256k1_memcmp_var(xonly_pubkey_bytes[i - 1], xonly_pubkey_bytes[EXHAUSTIVE_TEST_ORDER - i - 1], 32) == 0"
               );
        abort();
      }
      if (local_ac8[(int)(v - 1)] != 1 - local_ac8[(int)(0xc - v)]) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
                ,0x3d,
                "test condition failed: parities[i - 1] == 1 - parities[EXHAUSTIVE_TEST_ORDER - i - 1]"
               );
        abort();
      }
    }
    v = v + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
          ,0x29,
          "test condition failed: secp256k1_memcmp_var(xonly_pubkey_bytes[i - 1], buf, 32) == 0");
  abort();
}

Assistant:

static void test_exhaustive_extrakeys(const secp256k1_context *ctx, const secp256k1_ge* group) {
    secp256k1_keypair keypair[EXHAUSTIVE_TEST_ORDER - 1];
    secp256k1_pubkey pubkey[EXHAUSTIVE_TEST_ORDER - 1];
    secp256k1_xonly_pubkey xonly_pubkey[EXHAUSTIVE_TEST_ORDER - 1];
    int parities[EXHAUSTIVE_TEST_ORDER - 1];
    unsigned char xonly_pubkey_bytes[EXHAUSTIVE_TEST_ORDER - 1][32];
    int i;

    for (i = 1; i < EXHAUSTIVE_TEST_ORDER; i++) {
        secp256k1_fe fe;
        secp256k1_scalar scalar_i;
        unsigned char buf[33];
        int parity;

        secp256k1_scalar_set_int(&scalar_i, i);
        secp256k1_scalar_get_b32(buf, &scalar_i);

        /* Construct pubkey and keypair. */
        CHECK(secp256k1_keypair_create(ctx, &keypair[i - 1], buf));
        CHECK(secp256k1_ec_pubkey_create(ctx, &pubkey[i - 1], buf));

        /* Construct serialized xonly_pubkey from keypair. */
        CHECK(secp256k1_keypair_xonly_pub(ctx, &xonly_pubkey[i - 1], &parities[i - 1], &keypair[i - 1]));
        CHECK(secp256k1_xonly_pubkey_serialize(ctx, xonly_pubkey_bytes[i - 1], &xonly_pubkey[i - 1]));

        /* Parse the xonly_pubkey back and verify it matches the previously serialized value. */
        CHECK(secp256k1_xonly_pubkey_parse(ctx, &xonly_pubkey[i - 1], xonly_pubkey_bytes[i - 1]));
        CHECK(secp256k1_xonly_pubkey_serialize(ctx, buf, &xonly_pubkey[i - 1]));
        CHECK(secp256k1_memcmp_var(xonly_pubkey_bytes[i - 1], buf, 32) == 0);

        /* Construct the xonly_pubkey from the pubkey, and verify it matches the same. */
        CHECK(secp256k1_xonly_pubkey_from_pubkey(ctx, &xonly_pubkey[i - 1], &parity, &pubkey[i - 1]));
        CHECK(parity == parities[i - 1]);
        CHECK(secp256k1_xonly_pubkey_serialize(ctx, buf, &xonly_pubkey[i - 1]));
        CHECK(secp256k1_memcmp_var(xonly_pubkey_bytes[i - 1], buf, 32) == 0);

        /* Compare the xonly_pubkey bytes against the precomputed group. */
        secp256k1_fe_set_b32_mod(&fe, xonly_pubkey_bytes[i - 1]);
        CHECK(secp256k1_fe_equal_var(&fe, &group[i].x));

        /* Check the parity against the precomputed group. */
        fe = group[i].y;
        secp256k1_fe_normalize_var(&fe);
        CHECK(secp256k1_fe_is_odd(&fe) == parities[i - 1]);

        /* Verify that the higher half is identical to the lower half mirrored. */
        if (i > EXHAUSTIVE_TEST_ORDER / 2) {
            CHECK(secp256k1_memcmp_var(xonly_pubkey_bytes[i - 1], xonly_pubkey_bytes[EXHAUSTIVE_TEST_ORDER - i - 1], 32) == 0);
            CHECK(parities[i - 1] == 1 - parities[EXHAUSTIVE_TEST_ORDER - i - 1]);
        }
    }

    /* TODO: keypair/xonly_pubkey tweak tests */
}